

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall ThreadTrackerItem::ThreadTrackerItem(ThreadTrackerItem *this)

{
  allocator_type local_9;
  
  this->numStacks = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->aggrStackNameRaw,0x1000,&local_9);
  this->lenName = 0;
  (this->lenStack).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->lenStack;
  (this->lenStack).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->lenStack;
  (this->lenStack).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size = 0;
  return;
}

Assistant:

ThreadTrackerItem()
        : numStacks(0),
          aggrStackNameRaw(4096),
          lenName(0)
        {}